

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.cpp
# Opt level: O2

void __thiscall
SignerAttribute::Encode(SignerAttribute *this,uchar *pOut,size_t cbOut,size_t *cbUsed)

{
  size_t sVar1;
  uchar *puVar2;
  undefined1 auStack_58 [8];
  EncodeHelper eh;
  
  auStack_58 = (undefined1  [8])0x0;
  eh.offset = 0;
  eh.cbNeeded = 0;
  eh.cbCurrent = (size_t)cbUsed;
  sVar1 = DerBase::EncodedSize(&this->super_DerBase);
  EncodeHelper::Init((EncodeHelper *)auStack_58,sVar1,pOut,cbOut,'0',(this->super_DerBase).cbData);
  puVar2 = pOut + (long)auStack_58;
  sVar1 = EncodeHelper::DataSize((EncodeHelper *)auStack_58);
  EncodeSetOrSequenceOf<Attribute>
            (ConstructedSet,&this->claimedAttributes,puVar2,sVar1,&eh.cbNeeded);
  auStack_58 = (undefined1  [8])((long)auStack_58 + eh.cbNeeded);
  eh.cbNeeded = 0;
  puVar2 = pOut + (long)auStack_58;
  sVar1 = EncodeHelper::DataSize((EncodeHelper *)auStack_58);
  AttributeCertificate::Encode(&this->certifiedAttributes,puVar2,sVar1,&eh.cbNeeded);
  EncodeHelper::Finalize((EncodeHelper *)auStack_58);
  return;
}

Assistant:

void SignerAttribute::Encode(unsigned char * pOut, size_t cbOut, size_t & cbUsed)
{
    EncodeHelper eh(cbUsed);

    eh.Init(EncodedSize(), pOut, cbOut, static_cast<unsigned char>(DerType::ConstructedSequence), cbData);

    EncodeSetOrSequenceOf(DerType::ConstructedSet, claimedAttributes, eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
    eh.Update();

    certifiedAttributes.Encode(eh.DataPtr(pOut), eh.DataSize(), eh.CurrentSize());
    eh.Finalize();
}